

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bezier_arc.cpp
# Opt level: O0

int __thiscall agg::bezier_arc_svg::init(bezier_arc_svg *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  double *pdVar4;
  double *pdVar5;
  byte in_DL;
  ulong uVar6;
  double in_XMM0_Qa;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double local_1f8;
  double local_1e0;
  uint local_1cc;
  undefined1 local_1c8 [4];
  uint i;
  trans_affine_rotation local_198;
  undefined1 local_168 [8];
  trans_affine mtx;
  double sweep_angle;
  double start_angle;
  double v;
  double n;
  double p;
  double vy;
  double vx;
  double uy;
  double ux;
  double cy;
  double cx;
  double sy2;
  double sx2;
  double cy1;
  double cx1;
  double coef;
  double sq;
  double sign;
  double radii_check;
  double py1;
  double px1;
  double pry;
  double prx;
  double y1;
  double x1;
  double sin_a;
  double cos_a;
  double dy2;
  double dx2;
  double y2_local;
  double x2_local;
  bool sweep_flag_local;
  bool large_arc_flag_local;
  double angle_local;
  double ry_local;
  double rx_local;
  double y0_local;
  double x0_local;
  bezier_arc_svg *this_local;
  
  bVar1 = (byte)ctx;
  bVar2 = in_DL & 1;
  this[0xe0] = (bezier_arc_svg)0x1;
  ry_local = in_XMM2_Qa;
  if (in_XMM2_Qa < 0.0) {
    ry_local = -in_XMM2_Qa;
  }
  angle_local = in_XMM3_Qa;
  if (in_XMM3_Qa < 0.0) {
    angle_local = -ry_local;
  }
  dVar7 = (in_XMM0_Qa - in_XMM5_Qa) / 2.0;
  dVar8 = (in_XMM1_Qa - in_XMM6_Qa) / 2.0;
  dVar9 = cos(in_XMM4_Qa);
  dVar10 = sin(in_XMM4_Qa);
  dVar11 = dVar9 * dVar7 + dVar10 * dVar8;
  dVar7 = -dVar10 * dVar7 + dVar9 * dVar8;
  pry = ry_local * ry_local;
  px1 = angle_local * angle_local;
  dVar8 = dVar11 * dVar11;
  dVar12 = dVar7 * dVar7;
  dVar13 = dVar8 / pry + dVar12 / px1;
  if (1.0 < dVar13) {
    dVar14 = sqrt(dVar13);
    ry_local = dVar14 * ry_local;
    dVar14 = sqrt(dVar13);
    angle_local = dVar14 * angle_local;
    pry = ry_local * ry_local;
    px1 = angle_local * angle_local;
    if (10.0 < dVar13) {
      this[0xe0] = (bezier_arc_svg)0x0;
    }
  }
  local_1e0 = -1.0;
  if ((bVar1 & 1) != bVar2) {
    local_1e0 = 1.0;
  }
  local_1f8 = (-px1 * dVar8 + pry * px1 + -(pry * dVar12)) / (pry * dVar12 + px1 * dVar8);
  if (local_1f8 < 0.0) {
    local_1f8 = 0.0;
  }
  dVar8 = sqrt(local_1f8);
  dVar12 = local_1e0 * dVar8 * ((ry_local * dVar7) / angle_local);
  dVar8 = local_1e0 * dVar8 * -((angle_local * dVar11) / ry_local);
  dVar13 = (dVar11 - dVar12) / ry_local;
  dVar14 = (dVar7 - dVar8) / angle_local;
  dVar11 = (-dVar11 - dVar12) / ry_local;
  dVar7 = (-dVar7 - dVar8) / angle_local;
  dVar15 = sqrt(dVar13 * dVar13 + dVar14 * dVar14);
  start_angle = dVar13 / dVar15;
  if (start_angle < -1.0) {
    start_angle = -1.0;
  }
  if (1.0 < start_angle) {
    start_angle = 1.0;
  }
  acos(start_angle);
  dVar15 = sqrt((dVar13 * dVar13 + dVar14 * dVar14) * (dVar11 * dVar11 + dVar7 * dVar7));
  uVar6 = -(ulong)(dVar13 * dVar7 + -(dVar14 * dVar11) < 0.0);
  start_angle = (dVar13 * dVar11 + dVar14 * dVar7) / dVar15;
  if (start_angle < -1.0) {
    start_angle = -1.0;
  }
  if (1.0 < start_angle) {
    start_angle = 1.0;
  }
  dVar7 = acos(start_angle);
  mtx.ty = (double)(~uVar6 & 0x3ff0000000000000 | uVar6 & 0xbff0000000000000) * dVar7;
  if ((bVar2 != 0) || (mtx.ty <= 0.0)) {
    if ((bVar2 != 0) && (mtx.ty < 0.0)) {
      mtx.ty = mtx.ty + 6.283185307179586;
    }
  }
  else {
    mtx.ty = mtx.ty - 6.283185307179586;
  }
  bezier_arc::init((bezier_arc *)this,ctx);
  trans_affine_rotation::trans_affine_rotation(&local_198,in_XMM4_Qa);
  memcpy(local_168,&local_198,0x30);
  trans_affine_translation::trans_affine_translation
            ((trans_affine_translation *)local_1c8,
             (in_XMM0_Qa + in_XMM5_Qa) / 2.0 + dVar9 * dVar12 + -(dVar10 * dVar8),
             (in_XMM1_Qa + in_XMM6_Qa) / 2.0 + dVar10 * dVar12 + dVar9 * dVar8);
  trans_affine::operator*=((trans_affine *)local_168,(trans_affine *)local_1c8);
  for (local_1cc = 2; uVar3 = bezier_arc::num_vertices((bezier_arc *)this), local_1cc < uVar3 - 2;
      local_1cc = local_1cc + 2) {
    pdVar4 = bezier_arc::vertices((bezier_arc *)this);
    pdVar5 = bezier_arc::vertices((bezier_arc *)this);
    trans_affine::transform
              ((trans_affine *)local_168,pdVar4 + local_1cc,pdVar5 + (ulong)local_1cc + 1);
  }
  pdVar4 = bezier_arc::vertices((bezier_arc *)this);
  *pdVar4 = in_XMM0_Qa;
  pdVar4 = bezier_arc::vertices((bezier_arc *)this);
  pdVar4[1] = in_XMM1_Qa;
  uVar3 = bezier_arc::num_vertices((bezier_arc *)this);
  pdVar4 = (double *)(ulong)uVar3;
  if (2 < uVar3) {
    pdVar4 = bezier_arc::vertices((bezier_arc *)this);
    uVar3 = bezier_arc::num_vertices((bezier_arc *)this);
    pdVar4[uVar3 - 2] = in_XMM5_Qa;
    pdVar4 = bezier_arc::vertices((bezier_arc *)this);
    uVar3 = bezier_arc::num_vertices((bezier_arc *)this);
    pdVar4[uVar3 - 1] = in_XMM6_Qa;
  }
  return (int)pdVar4;
}

Assistant:

void bezier_arc_svg::init(double x0, double y0, 
                              double rx, double ry, 
                              double angle,
                              bool large_arc_flag,
                              bool sweep_flag,
                              double x2, double y2)
    {
        m_radii_ok = true;

        if(rx < 0.0) rx = -rx;
        if(ry < 0.0) ry = -rx;

        // Calculate the middle point between 
        // the current and the final points
        //------------------------
        double dx2 = (x0 - x2) / 2.0;
        double dy2 = (y0 - y2) / 2.0;

        double cos_a = cos(angle);
        double sin_a = sin(angle);

        // Calculate (x1, y1)
        //------------------------
        double x1 =  cos_a * dx2 + sin_a * dy2;
        double y1 = -sin_a * dx2 + cos_a * dy2;

        // Ensure radii are large enough
        //------------------------
        double prx = rx * rx;
        double pry = ry * ry;
        double px1 = x1 * x1;
        double py1 = y1 * y1;

        // Check that radii are large enough
        //------------------------
        double radii_check = px1/prx + py1/pry;
        if(radii_check > 1.0) 
        {
            rx = sqrt(radii_check) * rx;
            ry = sqrt(radii_check) * ry;
            prx = rx * rx;
            pry = ry * ry;
            if(radii_check > 10.0) m_radii_ok = false;
        }

        // Calculate (cx1, cy1)
        //------------------------
        double sign = (large_arc_flag == sweep_flag) ? -1.0 : 1.0;
        double sq   = (prx*pry - prx*py1 - pry*px1) / (prx*py1 + pry*px1);
        double coef = sign * sqrt((sq < 0) ? 0 : sq);
        double cx1  = coef *  ((rx * y1) / ry);
        double cy1  = coef * -((ry * x1) / rx);

        //
        // Calculate (cx, cy) from (cx1, cy1)
        //------------------------
        double sx2 = (x0 + x2) / 2.0;
        double sy2 = (y0 + y2) / 2.0;
        double cx = sx2 + (cos_a * cx1 - sin_a * cy1);
        double cy = sy2 + (sin_a * cx1 + cos_a * cy1);

        // Calculate the start_angle (angle1) and the sweep_angle (dangle)
        //------------------------
        double ux =  (x1 - cx1) / rx;
        double uy =  (y1 - cy1) / ry;
        double vx = (-x1 - cx1) / rx;
        double vy = (-y1 - cy1) / ry;
        double p, n;

        // Calculate the angle start
        //------------------------
        n = sqrt(ux*ux + uy*uy);
        p = ux; // (1 * ux) + (0 * uy)
        sign = (uy < 0) ? -1.0 : 1.0;
        double v = p / n;
        if(v < -1.0) v = -1.0;
        if(v >  1.0) v =  1.0;
        double start_angle = sign * acos(v);

        // Calculate the sweep angle
        //------------------------
        n = sqrt((ux*ux + uy*uy) * (vx*vx + vy*vy));
        p = ux * vx + uy * vy;
        sign = (ux * vy - uy * vx < 0) ? -1.0 : 1.0;
        v = p / n;
        if(v < -1.0) v = -1.0;
        if(v >  1.0) v =  1.0;
        double sweep_angle = sign * acos(v);
        if(!sweep_flag && sweep_angle > 0) 
        {
            sweep_angle -= pi * 2.0;
        } 
        else 
        if (sweep_flag && sweep_angle < 0) 
        {
            sweep_angle += pi * 2.0;
        }

        // We can now build and transform the resulting arc
        //------------------------
        m_arc.init(0.0, 0.0, rx, ry, start_angle, sweep_angle);
        trans_affine mtx = trans_affine_rotation(angle);
        mtx *= trans_affine_translation(cx, cy);
        
        for(unsigned i = 2; i < m_arc.num_vertices()-2; i += 2)
        {
            mtx.transform(m_arc.vertices() + i, m_arc.vertices() + i + 1);
        }

        // We must make sure that the starting and ending points
        // exactly coincide with the initial (x0,y0) and (x2,y2)
        m_arc.vertices()[0] = x0;
        m_arc.vertices()[1] = y0;
        if(m_arc.num_vertices() > 2)
        {
            m_arc.vertices()[m_arc.num_vertices() - 2] = x2;
            m_arc.vertices()[m_arc.num_vertices() - 1] = y2;
        }
    }